

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_tracemc(lua_State *L)

{
  uint64_t uVar1;
  long lVar2;
  TValue *pTVar3;
  uint uVar4;
  int iVar5;
  GCstr *pGVar6;
  
  uVar4 = lj_lib_checkint(L,1);
  iVar5 = 0;
  if ((((uVar4 != 0) && (uVar1 = (L->glref).ptr64, uVar4 < *(uint *)(uVar1 + 0x46c))) &&
      (lVar2 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar4 * 8), lVar2 != 0)) &&
     (iVar5 = 0, *(char **)(lVar2 + 0x58) != (char *)0x0)) {
    pTVar3 = L->top;
    pGVar6 = lj_str_new(L,*(char **)(lVar2 + 0x58),(ulong)*(uint *)(lVar2 + 0x54));
    pTVar3[-1].u64 = (ulong)pGVar6 | 0xfffd800000000000;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)*(long *)(lVar2 + 0x58);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)*(int *)(lVar2 + 0x60);
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}